

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ThreadSafeArena::AddCleanup
          (ThreadSafeArena *this,void *elem,_func_void_void_ptr *cleanup)

{
  long lVar1;
  SerialArena *this_00;
  long *in_FS_OFFSET;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  lVar1 = *in_FS_OFFSET;
  if (*(long *)(lVar1 + -0x38) == *(long *)this) {
    this_00 = *(SerialArena **)(lVar1 + -0x30);
  }
  else {
    this_00 = *(SerialArena **)(this + 0x18);
    if ((this_00 == (SerialArena *)0x0) || (this_00->owner_ != (void *)(lVar1 + -0x40))) {
      this_00 = GetSerialArenaFallback(this,(void *)(lVar1 + -0x40));
    }
  }
  pVar2 = SerialArena::AllocateAlignedWithCleanup
                    (this_00,0,(AllocationPolicy *)(*(ulong *)(this + 8) & 0xfffffffffffffff8));
  (pVar2.second)->elem = elem;
  (pVar2.second)->cleanup = cleanup;
  return;
}

Assistant:

void ThreadSafeArena::AddCleanup(void* elem, void (*cleanup)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_FALSE(!GetSerialArenaFast(&arena))) {
    arena = GetSerialArenaFallback(&thread_cache());
  }
  arena->AddCleanup(elem, cleanup, AllocPolicy());
}